

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

int __thiscall
Fl_Value_Input_Type::textstuff(Fl_Value_Input_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Type *pFVar1;
  
  if (w == 4) {
    this = (Fl_Value_Input_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.factory;
  }
  if ((uint)w < 5) {
    pFVar1 = ((Fl_Type *)((long)this + 0x78))->prev;
    switch(w) {
    default:
      *f = pFVar1[2].header_position;
      *s = pFVar1[2].code_position_end;
      *c = pFVar1[2].header_position_end;
      break;
    case 1:
      pFVar1[2].header_position = *f;
      break;
    case 2:
      pFVar1[2].code_position_end = *s;
      break;
    case 3:
      pFVar1[2].header_position_end = *c;
    }
  }
  return 1;
}

Assistant:

int Fl_Value_Input_Type::textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
  Fl_Value_Input *myo = (Fl_Value_Input*)(w==4 ? ((Fl_Widget_Type*)factory)->o : o);
  switch (w) {
    case 4:
    case 0: f = myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
  }
  return 1;
}